

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_add_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id)

{
  int *piVar1;
  int local_28;
  int i;
  int flt_id_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  if ((line->unpacked & 2U) == 0) {
    bcf_unpack(line,2);
  }
  for (local_28 = 0; (local_28 < (line->d).n_flt && (flt_id != (line->d).flt[local_28]));
      local_28 = local_28 + 1) {
  }
  if (local_28 < (line->d).n_flt) {
    hdr_local._4_4_ = 0;
  }
  else {
    (line->d).shared_dirty = (line->d).shared_dirty | 4;
    if (flt_id == 0) {
      (line->d).n_flt = 1;
    }
    else if (((line->d).n_flt == 1) && (*(line->d).flt == 0)) {
      (line->d).n_flt = 1;
    }
    else {
      (line->d).n_flt = (line->d).n_flt + 1;
    }
    if ((line->d).m_flt < (line->d).n_flt) {
      (line->d).m_flt = (line->d).n_flt;
      (line->d).m_flt = (line->d).m_flt + -1;
      (line->d).m_flt = (line->d).m_flt >> 1 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 2 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 4 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 8 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 0x10 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt + 1;
      piVar1 = (int *)realloc((line->d).flt,(long)(line->d).m_flt << 2);
      (line->d).flt = piVar1;
    }
    (line->d).flt[(line->d).n_flt + -1] = flt_id;
    hdr_local._4_4_ = 1;
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_add_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i<line->d.n_flt ) return 0;    // this filter is already set
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( flt_id==0 )    // set to PASS
        line->d.n_flt = 1;
    else if ( line->d.n_flt==1 && line->d.flt[0]==0 )
        line->d.n_flt = 1;
    else
        line->d.n_flt++;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    line->d.flt[line->d.n_flt-1] = flt_id;
    return 1;
}